

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O3

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,nop_statement_t *stmt)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  typed_nop_statement_t *ptVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_2d;
  statement_type_t local_2c;
  typed_nop_statement_t *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_2c = STMT_TYPE_NOP;
  local_28 = (typed_nop_statement_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<tchecker::typed_nop_statement_t,std::allocator<tchecker::typed_nop_statement_t>,tchecker::statement_type_t>
            (a_Stack_20,&local_28,(allocator<tchecker::typed_nop_statement_t> *)&local_2d,&local_2c)
  ;
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  ptVar1 = local_28;
  local_28 = (typed_nop_statement_t *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->_typed_stmt).
            super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &ptVar1->super_typed_statement_t;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

virtual void visit(tchecker::nop_statement_t const & stmt)
  {
    _typed_stmt = std::make_shared<tchecker::typed_nop_statement_t>(tchecker::STMT_TYPE_NOP);
  }